

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O1

void __thiscall capnp::DynamicValue::Pipeline::~Pipeline(Pipeline *this)

{
  PipelineOp *pPVar1;
  size_t sVar2;
  ArrayDisposer *pAVar3;
  Disposer *pDVar4;
  Disposer *pDVar5;
  Type local_1c;
  Fault f;
  
  local_1c = this->type;
  if (local_1c != UNKNOWN) {
    if (local_1c == CAPABILITY) {
      pDVar4 = (this->field_1).structValue.typeless.hook.disposer;
      if (pDVar4 != (Disposer *)0x0) {
        (this->field_1).structValue.typeless.hook.disposer = (Disposer *)0x0;
        pDVar5 = (this->field_1).capabilityValue.super_Client.hook.disposer;
LAB_001bc78b:
        (**pDVar5->_vptr_Disposer)
                  (pDVar5,pDVar4->_vptr_Disposer[-2] + (long)&pDVar4->_vptr_Disposer);
        return;
      }
    }
    else if (local_1c == STRUCT) {
      pPVar1 = (this->field_1).structValue.typeless.ops.ptr;
      if (pPVar1 != (PipelineOp *)0x0) {
        sVar2 = (this->field_1).structValue.typeless.ops.size_;
        (this->field_1).structValue.typeless.ops.ptr = (PipelineOp *)0x0;
        (this->field_1).structValue.typeless.ops.size_ = 0;
        pAVar3 = (this->field_1).structValue.typeless.ops.disposer;
        (**pAVar3->_vptr_ArrayDisposer)(pAVar3,pPVar1,8,sVar2,sVar2,0);
      }
      pDVar4 = (Disposer *)(this->field_1).structValue.typeless.hook.ptr;
      if (pDVar4 != (Disposer *)0x0) {
        (this->field_1).structValue.typeless.hook.ptr = (PipelineHook *)0x0;
        pDVar5 = (this->field_1).structValue.typeless.hook.disposer;
        goto LAB_001bc78b;
      }
    }
    else {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[26],unsigned_int>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic.c++"
                 ,0x69c,FAILED,(char *)0x0,"\"Unexpected pipeline type.\", (uint)type",
                 (char (*) [26])"Unexpected pipeline type.",&local_1c);
      this->type = UNKNOWN;
      kj::_::Debug::Fault::~Fault(&f);
    }
  }
  return;
}

Assistant:

DynamicValue::Pipeline::~Pipeline() noexcept(false) {
  switch (type) {
    case UNKNOWN: break;
    case STRUCT: kj::dtor(structValue); break;
    case CAPABILITY: kj::dtor(capabilityValue); break;
    default:
      KJ_FAIL_ASSERT("Unexpected pipeline type.", (uint)type) { type = UNKNOWN; break; }
      break;
  }
}